

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::Option::check_sname(Option *this,string *name)

{
  ptrdiff_t pVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  string local_38;
  string *local_18;
  string *name_local;
  Option *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_38,(string *)name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,&this->snames_);
  pVar1 = detail::find_member(&local_38,&local_50,
                              (bool)((this->super_OptionBase<CLI::Option>).ignore_case_ & 1),false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  ::std::__cxx11::string::~string((string *)&local_38);
  return -1 < pVar1;
}

Assistant:

bool check_sname(std::string name) const { return (detail::find_member(name, snames_, ignore_case_) >= 0); }